

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O0

void __thiscall InterpTest_Rot13_Test::TestBody(InterpTest_Rot13_Test *this)

{
  Limits limits;
  initializer_list<wabt::interp::Ref> __l;
  initializer_list<wabt::Type> __l_00;
  initializer_list<wabt::Type> __l_01;
  initializer_list<wabt::Type> __l_02;
  initializer_list<wabt::Type> __l_03;
  initializer_list<wabt::Type> __l_04;
  initializer_list<unsigned_char> __l_05;
  bool bVar1;
  Memory *this_00;
  HostFunc *pHVar2;
  DefinedFunc *pDVar3;
  char *pcVar4;
  AssertHelper local_5c0;
  Message local_5b8;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar_3;
  Message local_598;
  vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> local_590;
  Result local_578;
  Enum local_574;
  undefined1 local_570 [8];
  AssertionResult gtest_ar_2;
  Message local_558;
  undefined1 local_550 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_538;
  Message local_530;
  vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> local_528;
  Result local_510;
  Enum local_50c;
  undefined1 local_508 [8];
  AssertionResult gtest_ar;
  Ptr trap;
  Values results;
  Ptr rot13;
  Ref local_4a8;
  size_t local_4a0;
  size_t local_498;
  iterator local_490;
  size_type local_488;
  vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> local_480;
  Callback local_468;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_448;
  allocator<wabt::Type> local_429;
  Type local_428;
  Type TStack_420;
  iterator local_418;
  size_type local_410;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_408;
  FuncType local_3f0;
  undefined1 local_3b0 [8];
  Ptr buf_done_func;
  anon_class_16_2_e78ae302 buf_done;
  allocator<wabt::Type> local_361;
  Type local_360;
  iterator local_358;
  size_type local_350;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_348;
  allocator<wabt::Type> local_329;
  Type local_328;
  Type TStack_320;
  iterator local_318;
  size_type local_310;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_308;
  FuncType local_2f0;
  undefined1 local_2b0 [8];
  Ptr fill_buf_func;
  anon_class_16_2_d8df2ea0 fill_buf;
  undefined8 local_280;
  undefined8 local_278;
  MemoryType local_270;
  undefined1 local_240 [8];
  Ptr memory;
  undefined1 local_220 [8];
  string string_data;
  Callback local_1f8;
  allocator<wabt::Type> local_1d1;
  Type local_1d0;
  iterator local_1c8;
  size_type local_1c0;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_1b8;
  allocator<wabt::Type> local_199;
  Type local_198;
  iterator local_190;
  size_type local_188;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_180;
  FuncType local_168;
  undefined1 local_128 [8];
  Ptr host_func;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  InterpTest_Rot13_Test *local_10;
  InterpTest_Rot13_Test *this_local;
  
  local_10 = this;
  memcpy((void *)((long)&host_func.root_index_ + 5),&DAT_0030d61c,0xd3);
  std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)((long)&host_func.root_index_ + 4));
  __l_05._M_len = 0xd3;
  __l_05._M_array = (iterator)((long)&host_func.root_index_ + 5);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_28,__l_05,(allocator_type *)((long)&host_func.root_index_ + 4));
  InterpTest::ReadModule(&this->super_InterpTest,&local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_28);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)((long)&host_func.root_index_ + 4));
  wabt::Type::Type(&local_198,I32);
  local_190 = &local_198;
  local_188 = 1;
  std::allocator<wabt::Type>::allocator(&local_199);
  __l_04._M_len = local_188;
  __l_04._M_array = local_190;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_180,__l_04,&local_199);
  wabt::Type::Type(&local_1d0,I32);
  local_1c8 = &local_1d0;
  local_1c0 = 1;
  std::allocator<wabt::Type>::allocator(&local_1d1);
  __l_03._M_len = local_1c0;
  __l_03._M_array = local_1c8;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_1b8,__l_03,&local_1d1);
  wabt::interp::FuncType::FuncType(&local_168,&local_180,&local_1b8);
  std::
  function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
  ::function<InterpTest_Rot13_Test::TestBody()::__0,void>
            ((function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
              *)&local_1f8,(anon_class_1_0_00000001 *)(string_data.field_2._M_local_buf + 0xf));
  wabt::interp::HostFunc::New
            ((Ptr *)local_128,&(this->super_InterpTest).store_,&local_168,&local_1f8);
  std::
  function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
  ::~function(&local_1f8);
  wabt::interp::FuncType::~FuncType(&local_168);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_1b8);
  std::allocator<wabt::Type>::~allocator(&local_1d1);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_180);
  std::allocator<wabt::Type>::~allocator(&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_220,"Hello, WebAssembly!",
             (allocator<char> *)((long)&memory.root_index_ + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&memory.root_index_ + 7));
  wabt::Limits::Limits((Limits *)&fill_buf.memory,1);
  limits.max = local_280;
  limits.initial = (uint64_t)fill_buf.memory;
  limits._16_8_ = local_278;
  wabt::interp::MemoryType::MemoryType(&local_270,limits,0x10000);
  wabt::interp::Memory::New((Ptr *)local_240,&(this->super_InterpTest).store_,&local_270);
  wabt::interp::MemoryType::~MemoryType(&local_270);
  fill_buf_func.root_index_ = (Index)local_220;
  fill_buf.string_data = (string *)local_240;
  wabt::Type::Type(&local_328,I32);
  wabt::Type::Type(&TStack_320,I32);
  local_318 = &local_328;
  local_310 = 2;
  std::allocator<wabt::Type>::allocator(&local_329);
  __l_02._M_len = local_310;
  __l_02._M_array = local_318;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_308,__l_02,&local_329);
  wabt::Type::Type(&local_360,I32);
  local_358 = &local_360;
  local_350 = 1;
  std::allocator<wabt::Type>::allocator(&local_361);
  __l_01._M_len = local_350;
  __l_01._M_array = local_358;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_348,__l_01,&local_361);
  wabt::interp::FuncType::FuncType(&local_2f0,&local_308,&local_348);
  std::
  function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
  ::function<InterpTest_Rot13_Test::TestBody()::__1&,void>
            ((function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
              *)&buf_done.string_data,(anon_class_16_2_d8df2ea0 *)&fill_buf_func.root_index_);
  wabt::interp::HostFunc::New
            ((Ptr *)local_2b0,&(this->super_InterpTest).store_,&local_2f0,
             (Callback *)&buf_done.string_data);
  std::
  function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
  ::~function((function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
               *)&buf_done.string_data);
  wabt::interp::FuncType::~FuncType(&local_2f0);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_348);
  std::allocator<wabt::Type>::~allocator(&local_361);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_308);
  std::allocator<wabt::Type>::~allocator(&local_329);
  buf_done_func.root_index_ = (Index)local_240;
  buf_done.memory = (Ptr *)local_220;
  wabt::Type::Type(&local_428,I32);
  wabt::Type::Type(&TStack_420,I32);
  local_418 = &local_428;
  local_410 = 2;
  std::allocator<wabt::Type>::allocator(&local_429);
  __l_00._M_len = local_410;
  __l_00._M_array = local_418;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_408,__l_00,&local_429);
  memset(&local_448,0,0x18);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_448);
  wabt::interp::FuncType::FuncType(&local_3f0,&local_408,&local_448);
  std::
  function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
  ::function<InterpTest_Rot13_Test::TestBody()::__2&,void>
            ((function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
              *)&local_468,(anon_class_16_2_e78ae302 *)&buf_done_func.root_index_);
  wabt::interp::HostFunc::New
            ((Ptr *)local_3b0,&(this->super_InterpTest).store_,&local_3f0,&local_468);
  std::
  function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
  ::~function(&local_468);
  wabt::interp::FuncType::~FuncType(&local_3f0);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_448);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_408);
  std::allocator<wabt::Type>::~allocator(&local_429);
  this_00 = wabt::interp::RefPtr<wabt::interp::Memory>::operator->
                      ((RefPtr<wabt::interp::Memory> *)local_240);
  local_4a8 = wabt::interp::Object::self((Object *)this_00);
  pHVar2 = wabt::interp::RefPtr<wabt::interp::HostFunc>::operator->
                     ((RefPtr<wabt::interp::HostFunc> *)local_2b0);
  local_4a0 = (size_t)wabt::interp::Object::self((Object *)pHVar2);
  pHVar2 = wabt::interp::RefPtr<wabt::interp::HostFunc>::operator->
                     ((RefPtr<wabt::interp::HostFunc> *)local_3b0);
  local_498 = (size_t)wabt::interp::Object::self((Object *)pHVar2);
  local_490 = &local_4a8;
  local_488 = 3;
  std::allocator<wabt::interp::Ref>::allocator
            ((allocator<wabt::interp::Ref> *)((long)&rot13.root_index_ + 7));
  __l._M_len = local_488;
  __l._M_array = local_490;
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::vector
            (&local_480,__l,(allocator_type *)((long)&rot13.root_index_ + 7));
  InterpTest::Instantiate(&this->super_InterpTest,&local_480);
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~vector(&local_480);
  std::allocator<wabt::interp::Ref>::~allocator
            ((allocator<wabt::interp::Ref> *)((long)&rot13.root_index_ + 7));
  InterpTest::GetFuncExport
            ((Ptr *)&results.
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,&this->super_InterpTest,0);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&trap.root_index_)
  ;
  wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr((RefPtr<wabt::interp::Trap> *)&gtest_ar.message_)
  ;
  local_50c = Ok;
  pDVar3 = wabt::interp::RefPtr<wabt::interp::DefinedFunc>::operator->
                     ((RefPtr<wabt::interp::DefinedFunc> *)
                      &results.
                       super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  memset(&local_528,0,0x18);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector(&local_528);
  local_510 = wabt::interp::Func::Call
                        (&pDVar3->super_Func,&(this->super_InterpTest).store_,&local_528,
                         (Values *)&trap.root_index_,(Ptr *)&gtest_ar.message_,(Stream *)0x0);
  testing::internal::EqHelper::Compare<wabt::Result::Enum,_wabt::Result,_nullptr>
            ((EqHelper *)local_508,"Result::Ok","rot13->Call(store_, {}, results, &trap)",&local_50c
             ,&local_510);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector(&local_528);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_508);
  if (!bVar1) {
    testing::Message::Message(&local_530);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_508);
    testing::internal::AssertHelper::AssertHelper
              (&local_538,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0x22c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_538,&local_530);
    testing::internal::AssertHelper::~AssertHelper(&local_538);
    testing::Message::~Message(&local_530);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    testing::internal::EqHelper::
    Compare<char[20],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_550,"\"Uryyb, JroNffrzoyl!\"","string_data",
               (char (*) [20])"Uryyb, JroNffrzoyl!",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_550);
    if (!bVar1) {
      testing::Message::Message(&local_558);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_550);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
                 ,0x22e,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_558);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_558);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_550);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_574 = Ok;
      pDVar3 = wabt::interp::RefPtr<wabt::interp::DefinedFunc>::operator->
                         ((RefPtr<wabt::interp::DefinedFunc> *)
                          &results.
                           super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      memset(&local_590,0,0x18);
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector(&local_590);
      local_578 = wabt::interp::Func::Call
                            (&pDVar3->super_Func,&(this->super_InterpTest).store_,&local_590,
                             (Values *)&trap.root_index_,(Ptr *)&gtest_ar.message_,(Stream *)0x0);
      testing::internal::EqHelper::Compare<wabt::Result::Enum,_wabt::Result,_nullptr>
                ((EqHelper *)local_570,"Result::Ok","rot13->Call(store_, {}, results, &trap)",
                 &local_574,&local_578);
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector(&local_590);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_570);
      if (!bVar1) {
        testing::Message::Message(&local_598);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_570);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
                   ,0x230,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_598);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_598);
      }
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_570);
      if (gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        testing::internal::EqHelper::
        Compare<char[20],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                  ((EqHelper *)local_5b0,"\"Hello, WebAssembly!\"","string_data",
                   (char (*) [20])"Hello, WebAssembly!",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b0);
        if (!bVar1) {
          testing::Message::Message(&local_5b8);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_5b0);
          testing::internal::AssertHelper::AssertHelper
                    (&local_5c0,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
                     ,0x232,pcVar4);
          testing::internal::AssertHelper::operator=(&local_5c0,&local_5b8);
          testing::internal::AssertHelper::~AssertHelper(&local_5c0);
          testing::Message::~Message(&local_5b8);
        }
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
        if (gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ = 0;
        }
      }
    }
  }
  wabt::interp::RefPtr<wabt::interp::Trap>::~RefPtr
            ((RefPtr<wabt::interp::Trap> *)&gtest_ar.message_);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&trap.root_index_)
  ;
  wabt::interp::RefPtr<wabt::interp::DefinedFunc>::~RefPtr
            ((RefPtr<wabt::interp::DefinedFunc> *)
             &results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  wabt::interp::RefPtr<wabt::interp::HostFunc>::~RefPtr((RefPtr<wabt::interp::HostFunc> *)local_3b0)
  ;
  wabt::interp::RefPtr<wabt::interp::HostFunc>::~RefPtr((RefPtr<wabt::interp::HostFunc> *)local_2b0)
  ;
  wabt::interp::RefPtr<wabt::interp::Memory>::~RefPtr((RefPtr<wabt::interp::Memory> *)local_240);
  std::__cxx11::string::~string((string *)local_220);
  wabt::interp::RefPtr<wabt::interp::HostFunc>::~RefPtr((RefPtr<wabt::interp::HostFunc> *)local_128)
  ;
  return;
}

Assistant:

TEST_F(InterpTest, Rot13) {
  // (import "host" "mem" (memory $mem 1))
  // (import "host" "fill_buf" (func $fill_buf (param i32 i32) (result i32)))
  // (import "host" "buf_done" (func $buf_done (param i32 i32)))
  //
  // (func $rot13c (param $c i32) (result i32)
  //   (local $uc i32)
  //
  //   ;; No change if < 'A'.
  //   (if (i32.lt_u (local.get $c) (i32.const 65))
  //     (return (local.get $c)))
  //
  //   ;; Clear 5th bit of c, to force uppercase. 0xdf = 0b11011111
  //   (local.set $uc (i32.and (local.get $c) (i32.const 0xdf)))
  //
  //   ;; In range ['A', 'M'] return |c| + 13.
  //   (if (i32.le_u (local.get $uc) (i32.const 77))
  //     (return (i32.add (local.get $c) (i32.const 13))))
  //
  //   ;; In range ['N', 'Z'] return |c| - 13.
  //   (if (i32.le_u (local.get $uc) (i32.const 90))
  //     (return (i32.sub (local.get $c) (i32.const 13))))
  //
  //   ;; No change for everything else.
  //   (return (local.get $c))
  // )
  //
  // (func (export "rot13")
  //   (local $size i32)
  //   (local $i i32)
  //
  //   ;; Ask host to fill memory [0, 1024) with data.
  //   (call $fill_buf (i32.const 0) (i32.const 1024))
  //
  //   ;; The host returns the size filled.
  //   (local.set $size)
  //
  //   ;; Loop over all bytes and rot13 them.
  //   (block $exit
  //     (loop $top
  //       ;; if (i >= size) break
  //       (if (i32.ge_u (local.get $i) (local.get $size)) (br $exit))
  //
  //       ;; mem[i] = rot13c(mem[i])
  //       (i32.store8
  //         (local.get $i)
  //         (call $rot13c
  //           (i32.load8_u (local.get $i))))
  //
  //       ;; i++
  //       (local.set $i (i32.add (local.get $i) (i32.const 1)))
  //       (br $top)
  //     )
  //   )
  //
  //   (call $buf_done (i32.const 0) (local.get $size))
  // )
  ReadModule({
      0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00, 0x01, 0x14, 0x04, 0x60,
      0x02, 0x7f, 0x7f, 0x01, 0x7f, 0x60, 0x02, 0x7f, 0x7f, 0x00, 0x60, 0x01,
      0x7f, 0x01, 0x7f, 0x60, 0x00, 0x00, 0x02, 0x2d, 0x03, 0x04, 0x68, 0x6f,
      0x73, 0x74, 0x03, 0x6d, 0x65, 0x6d, 0x02, 0x00, 0x01, 0x04, 0x68, 0x6f,
      0x73, 0x74, 0x08, 0x66, 0x69, 0x6c, 0x6c, 0x5f, 0x62, 0x75, 0x66, 0x00,
      0x00, 0x04, 0x68, 0x6f, 0x73, 0x74, 0x08, 0x62, 0x75, 0x66, 0x5f, 0x64,
      0x6f, 0x6e, 0x65, 0x00, 0x01, 0x03, 0x03, 0x02, 0x02, 0x03, 0x07, 0x09,
      0x01, 0x05, 0x72, 0x6f, 0x74, 0x31, 0x33, 0x00, 0x03, 0x0a, 0x74, 0x02,
      0x39, 0x01, 0x01, 0x7f, 0x20, 0x00, 0x41, 0xc1, 0x00, 0x49, 0x04, 0x40,
      0x20, 0x00, 0x0f, 0x0b, 0x20, 0x00, 0x41, 0xdf, 0x01, 0x71, 0x21, 0x01,
      0x20, 0x01, 0x41, 0xcd, 0x00, 0x4d, 0x04, 0x40, 0x20, 0x00, 0x41, 0x0d,
      0x6a, 0x0f, 0x0b, 0x20, 0x01, 0x41, 0xda, 0x00, 0x4d, 0x04, 0x40, 0x20,
      0x00, 0x41, 0x0d, 0x6b, 0x0f, 0x0b, 0x20, 0x00, 0x0f, 0x0b, 0x38, 0x01,
      0x02, 0x7f, 0x41, 0x00, 0x41, 0x80, 0x08, 0x10, 0x00, 0x21, 0x00, 0x02,
      0x40, 0x03, 0x40, 0x20, 0x01, 0x20, 0x00, 0x4f, 0x04, 0x40, 0x0c, 0x02,
      0x0b, 0x20, 0x01, 0x20, 0x01, 0x2d, 0x00, 0x00, 0x10, 0x02, 0x3a, 0x00,
      0x00, 0x20, 0x01, 0x41, 0x01, 0x6a, 0x21, 0x01, 0x0c, 0x00, 0x0b, 0x0b,
      0x41, 0x00, 0x20, 0x00, 0x10, 0x01, 0x0b,
  });

  auto host_func =
      HostFunc::New(store_, FuncType{{ValueType::I32}, {ValueType::I32}},
                    [](Thread& thread, const Values& params, Values& results,
                       Trap::Ptr* out_trap) -> Result {
                      results[0] = Value::Make(params[0].Get<u32>() + 1);
                      return Result::Ok;
                    });

  std::string string_data = "Hello, WebAssembly!";

  auto memory =
      Memory::New(store_, MemoryType{Limits{1}, WABT_DEFAULT_PAGE_SIZE});

  auto fill_buf = [&](Thread& thread, const Values& params, Values& results,
                      Trap::Ptr* out_trap) -> Result {
    // (param $ptr i32) (param $max_size i32) (result $size i32)
    EXPECT_EQ(2u, params.size());
    EXPECT_EQ(1u, results.size());

    u32 ptr = params[0].Get<u32>();
    u32 max_size = params[1].Get<u32>();
    u32 size = std::min(max_size, u32(string_data.size()));

    EXPECT_LT(ptr + size, memory->ByteSize());

#if WABT_BIG_ENDIAN
    std::copy(string_data.rbegin(), string_data.rbegin() + size,
              memory->UnsafeData() + memory->ByteSize() - ptr - size);
#else
    std::copy(string_data.begin(), string_data.begin() + size,
              memory->UnsafeData() + ptr);
#endif

    results[0].Set(size);
    return Result::Ok;
  };
  auto fill_buf_func = HostFunc::New(
      store_, FuncType{{ValueType::I32, ValueType::I32}, {ValueType::I32}},
      fill_buf);

  auto buf_done = [&](Thread& thread, const Values& params, Values& results,
                      Trap::Ptr* out_trap) -> Result {
    // (param $ptr i32) (param $size i32)
    EXPECT_EQ(2u, params.size());
    EXPECT_EQ(0u, results.size());

    u32 ptr = params[0].Get<u32>();
    u32 size = params[1].Get<u32>();

    EXPECT_LT(ptr + size, memory->ByteSize());

    string_data.resize(size);
#if WABT_BIG_ENDIAN
    std::copy(memory->UnsafeData() + memory->ByteSize() - ptr - size,
              memory->UnsafeData() + memory->ByteSize() - ptr,
              string_data.rbegin());
#else
    std::copy(memory->UnsafeData() + ptr, memory->UnsafeData() + ptr + size,
              string_data.begin());
#endif

    return Result::Ok;
  };
  auto buf_done_func = HostFunc::New(
      store_, FuncType{{ValueType::I32, ValueType::I32}, {}}, buf_done);

  Instantiate({memory->self(), fill_buf_func->self(), buf_done_func->self()});

  auto rot13 = GetFuncExport(0);

  Values results;
  Trap::Ptr trap;
  ASSERT_EQ(Result::Ok, rot13->Call(store_, {}, results, &trap));

  ASSERT_EQ("Uryyb, JroNffrzoyl!", string_data);

  ASSERT_EQ(Result::Ok, rot13->Call(store_, {}, results, &trap));

  ASSERT_EQ("Hello, WebAssembly!", string_data);
}